

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

uint16_t bf_peek_uint16_le(bfile_t *bfile)

{
  int iVar1;
  long in_RDI;
  int bufoff;
  uint16_t value;
  bfile_t *in_stack_00000020;
  uint16_t local_2;
  
  if (((int)(*(ulong *)(in_RDI + 0x18) % (ulong)*(uint *)(in_RDI + 0x38)) == 0) &&
     (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x20))) {
    bf_read_buffer(in_stack_00000020);
  }
  if (*(long *)(in_RDI + 0x20) - 2U < *(ulong *)(in_RDI + 0x18)) {
    fprintf(_stderr,"bfile warning: could not peek on next uint16.\n");
    local_2 = 0;
  }
  else {
    iVar1 = (int)(*(ulong *)(in_RDI + 0x18) % (ulong)*(uint *)(in_RDI + 0x38));
    local_2 = CONCAT11(*(undefined1 *)
                        (*(long *)(in_RDI + 0x30) +
                        (long)(int)((iVar1 + 1U) % *(uint *)(in_RDI + 0x38))),
                       *(undefined1 *)(*(long *)(in_RDI + 0x30) + (long)iVar1));
  }
  return local_2;
}

Assistant:

uint16_t
bf_peek_uint16_le(
    bfile_t * bfile )
{
    uint16_t value;
    int bufoff;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    bufoff = bfile->pos % bfile->buffer_size;
    if ( (bufoff == 0) && (bfile->pos == bfile->ipos) )
        bf_read_buffer( bfile );

    if ( bfile->pos > (bfile->ipos - 2) ) {
        fprintf( stderr,
            "bfile warning: could not peek on next uint16.\n" );
        return 0;
    }

    bufoff = bfile->pos % bfile->buffer_size;
    value = bfile->buffer[bufoff];
    bufoff = (bufoff + 1) % bfile->buffer_size;
    value = value | (bfile->buffer[bufoff] << 8);

    return value;
}